

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O0

bool __thiscall undo::UndoHistory::deleteFirstState(UndoHistory *this)

{
  UndoState *pUVar1;
  UndoState *pUVar2;
  UndoState *state;
  UndoState *k;
  UndoState *j;
  UndoState *i;
  UndoHistory *this_local;
  
  if (this->m_cur == this->m_first) {
    this_local._7_1_ = false;
  }
  else {
    for (j = this->m_last; j != (UndoState *)0x0; j = UndoState::prev(j)) {
      if (j->m_parent == this->m_first) {
        k = this->m_first;
        while( true ) {
          if (k == j) {
            k = this->m_first;
            while (k != j) {
              pUVar1 = UndoState::next(k);
              deleteState(this,k);
              k = pUVar1;
            }
            j->m_prev = (UndoState *)0x0;
            j->m_parent = (UndoState *)0x0;
            this->m_first = j;
            return true;
          }
          if (this->m_cur == k) break;
          k = UndoState::next(k);
        }
        return false;
      }
    }
    pUVar1 = this->m_first;
    if (this->m_last != this->m_first) {
      __assert_fail("m_last == m_first",
                    "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp"
                    ,0x85,"bool undo::UndoHistory::deleteFirstState()");
    }
    pUVar2 = UndoState::next(this->m_first);
    if (pUVar2 != (UndoState *)0x0) {
      __assert_fail("m_first->next() == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp"
                    ,0x86,"bool undo::UndoHistory::deleteFirstState()");
    }
    this->m_last = (UndoState *)0x0;
    this->m_first = (UndoState *)0x0;
    deleteState(this,pUVar1);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool UndoHistory::deleteFirstState()
{
  UNDO_TRACE("UndoHistory::deleteFirstState()\n");

  // We cannot delete the first state if we are in the first state.
  if (m_cur == m_first) {
    UNDO_TRACE(" - Cannot delete first state if it's the current state\n");
    return false;
  }

  UndoState* i = m_last;
  while (i) {
    // If this state depends on the delete one, this "i" is the new
    // m_first undo state.
    if (i->m_parent == m_first) {
      // First we check if the current undo state is one of the states
      // that we're going to delete.
      UndoState* j = m_first;
      while (j != i) {
        // Cannot delete this "j" state because is the current one.
        if (m_cur == j) {
          UNDO_TRACE(" - Cannot delete first state because current state depends on it to go to the last state\n");
          return false;
        }
        j = j->next();
      }

      j = m_first;
      while (j != i) {
        UNDO_TRACE(" - Delete undo state\n");

        UndoState* k = j;
        j = j->next();

        deleteState(k);
      }

      i->m_prev = nullptr;
      i->m_parent = nullptr;
      m_first = i;
      return true;
    }
    i = i->prev();
  }

  UndoState* state = m_first;
  assert(m_last == m_first);
  assert(m_first->next() == nullptr);
  m_first = m_last = nullptr;
  UNDO_TRACE(" - Delete first state only\n");

  deleteState(state);
  return true;
}